

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eglwLibrary.cpp
# Opt level: O0

void __thiscall eglw::DefaultLibrary::DefaultLibrary(DefaultLibrary *this,char *dynamicLibraryName)

{
  DynamicLibrary *this_00;
  undefined1 local_58 [8];
  ExtLoader loader_1;
  CoreLoader loader;
  char *dynamicLibraryName_local;
  DefaultLibrary *this_local;
  
  FuncPtrLibrary::FuncPtrLibrary(&this->super_FuncPtrLibrary);
  (this->super_FuncPtrLibrary).super_Library._vptr_Library = (_func_int **)&PTR_bindAPI_0169dc60;
  this->m_dynLib = (DynamicLibrary *)0x0;
  if (dynamicLibraryName != (char *)0x0) {
    this_00 = (DynamicLibrary *)operator_new(8);
    de::DynamicLibrary::DynamicLibrary(this_00,dynamicLibraryName);
    this->m_dynLib = this_00;
  }
  eglw::anon_unknown_0::CoreLoader::CoreLoader
            ((CoreLoader *)&loader_1.m_getProcAddress,this->m_dynLib);
  initCore(&(this->super_FuncPtrLibrary).m_egl,(FunctionLoader *)&loader_1.m_getProcAddress);
  eglw::anon_unknown_0::CoreLoader::~CoreLoader((CoreLoader *)&loader_1.m_getProcAddress);
  if ((this->super_FuncPtrLibrary).m_egl.getProcAddress != (eglGetProcAddressFunc)0x0) {
    eglw::anon_unknown_0::ExtLoader::ExtLoader
              ((ExtLoader *)local_58,(this->super_FuncPtrLibrary).m_egl.getProcAddress);
    initExtensions(&(this->super_FuncPtrLibrary).m_egl,(FunctionLoader *)local_58);
  }
  return;
}

Assistant:

DefaultLibrary::DefaultLibrary (const char* dynamicLibraryName)
	: m_dynLib(DE_NULL)
{
	if (dynamicLibraryName)
		m_dynLib = new de::DynamicLibrary(dynamicLibraryName);

	{
		const CoreLoader loader(m_dynLib);
		initCore(&m_egl, &loader);
	}

	if (m_egl.getProcAddress)
	{
		const ExtLoader loader(m_egl.getProcAddress);
		initExtensions(&m_egl, &loader);
	}
}